

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,IfStatement *statement)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *psVar1;
  int iVar2;
  ulong in_RAX;
  Value *pVVar3;
  _Elt_pointer piVar4;
  Statement *pSVar5;
  undefined8 uStack_38;
  
  pSVar5 = statement->else_statement_;
  uStack_38 = in_RAX;
  pVVar3 = TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node);
  iVar2 = (*pVVar3->_vptr_Value[2])(pVVar3);
  if (pSVar5 == (Statement *)0x0) {
    if (iVar2 == 0) {
      return;
    }
    TraverseToChildByIndex(this);
    psVar1 = &this->offsets_;
    uStack_38 = (ulong)(uint)uStack_38;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>
              (&psVar1->c,(int *)((long)&uStack_38 + 4));
    FrameEmulator::AllocScope(&this->frame_);
    FunctionTable::BeginScope(&this->table_);
    (**(statement->if_statement_->super_Node)._vptr_Node)(statement->if_statement_,this);
    std::deque<int,_std::allocator<int>_>::pop_back(&psVar1->c);
    piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar4 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar2 = piVar4[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&psVar1->c);
    iVar2 = iVar2 + 1;
  }
  else {
    TraverseToChildByIndex(this);
    psVar1 = &this->offsets_;
    if (iVar2 == 0) {
      uStack_38 = uStack_38 & 0xffffffff;
      std::deque<int,_std::allocator<int>_>::emplace_back<int>
                (&psVar1->c,(int *)((long)&uStack_38 + 4));
      FrameEmulator::AllocScope(&this->frame_);
      FunctionTable::BeginScope(&this->table_);
      pSVar5 = statement->else_statement_;
    }
    else {
      uStack_38 = uStack_38 & 0xffffffff;
      std::deque<int,_std::allocator<int>_>::emplace_back<int>
                (&psVar1->c,(int *)((long)&uStack_38 + 4));
      FrameEmulator::AllocScope(&this->frame_);
      FunctionTable::BeginScope(&this->table_);
      pSVar5 = statement->if_statement_;
    }
    (**(pSVar5->super_Node)._vptr_Node)(pSVar5,this);
    std::deque<int,_std::allocator<int>_>::pop_back(&psVar1->c);
    piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar4 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar4 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar2 = piVar4[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&psVar1->c);
    iVar2 = iVar2 + 2;
  }
  uStack_38 = CONCAT44(iVar2,(uint)uStack_38);
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->offsets_).c,(int *)((long)&uStack_38 + 4));
  this->current_layer_ = this->current_layer_->parent_;
  FrameEmulator::DeallocScope(&this->frame_);
  FunctionTable::EndScope(&this->table_);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(IfStatement* statement) {
  if (statement->else_statement_ == nullptr) {
    if (Accept(statement->expression_)->GetValue()) {
      TraverseToChildByIndex();

      offsets_.push(0);
      frame_.AllocScope();
      table_.BeginScope();

      statement->if_statement_->Accept(this);

      offsets_.pop();
      size_t index = offsets_.top();
      offsets_.pop();
      offsets_.push(index + 1);

      current_layer_ = current_layer_->parent_;

      frame_.DeallocScope();
      table_.EndScope();
    }
  } else {
    if (Accept(statement->expression_)->GetValue()) {
      TraverseToChildByIndex();

      offsets_.push(0);
      frame_.AllocScope();
      table_.BeginScope();

      statement->if_statement_->Accept(this);

      offsets_.pop();
      size_t index = offsets_.top();
      offsets_.pop();
      offsets_.push(index + 2);

      current_layer_ = current_layer_->parent_;

      frame_.DeallocScope();
      table_.EndScope();
    } else {
      TraverseToChildByIndex();

      offsets_.push(0);
      frame_.AllocScope();
      table_.BeginScope();

      statement->else_statement_->Accept(this);

      offsets_.pop();
      size_t index = offsets_.top();
      offsets_.pop();
      offsets_.push(index + 2);

      current_layer_ = current_layer_->parent_;

      frame_.DeallocScope();
      table_.EndScope();
    }
  }
}